

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

int __thiscall pstore::file::file_handle::rename(file_handle *this,char *__old,char *__new)

{
  uint uVar1;
  char *__to;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  uint *puVar5;
  ostream *__os;
  int iVar6;
  errno_erc erc;
  _Alloc_hider _Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream message;
  
  std::__cxx11::string::string((string *)&local_1c8,(string *)&this->path_);
  __to = *(char **)__old;
  iVar3 = -100;
  uVar4 = syscall(0x13c,0xffffff9c,local_1c8._M_dataplus._M_p,0xffffffffffffff9c,__to,1);
  puVar5 = (uint *)__errno_location();
  if ((long)uVar4 < 0) {
    uVar4 = (ulong)*puVar5;
    bVar2 = anon_unknown.dwarf_3167dc::rename_noreplace::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)(ulong)*puVar5,iVar3);
    if (bVar2) {
      _Var7._M_p = local_1c8._M_dataplus._M_p;
      iVar3 = linkat(-100,local_1c8._M_dataplus._M_p,-100,__to,0);
      if (iVar3 < 0) {
        uVar1 = *puVar5;
        uVar4 = (ulong)uVar1;
        bVar2 = anon_unknown.dwarf_3167dc::rename_noreplace::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(ulong)uVar1,(int)_Var7._M_p);
        if (uVar1 == 1 || bVar2) {
          iVar6 = 0;
          iVar3 = faccessat(-100,__to,0,0x100);
          if (-1 < iVar3) goto LAB_00184d8d;
          uVar4 = (ulong)*puVar5;
          if (*puVar5 == 2) {
            iVar3 = renameat(-100,local_1c8._M_dataplus._M_p,-100,__to);
            if (-1 < iVar3) goto LAB_00184d7f;
            uVar4 = (ulong)*puVar5;
          }
        }
      }
      else {
        iVar3 = unlinkat(-100,local_1c8._M_dataplus._M_p,0);
        if (-1 < iVar3) goto LAB_00184d7f;
        uVar4 = (ulong)*puVar5;
        unlinkat(-100,__to,0);
      }
    }
    erc.err_ = (int)uVar4;
    if (0 < erc.err_) {
      if (erc.err_ != 0x11) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
        __os = std::operator<<((ostream *)&message,"Unable to rename ");
        local_1e8._M_dataplus._M_p = (pointer)&local_1c8;
        local_1e8._M_string_length._0_2_ = 0x22;
        std::__detail::operator<<
                  (__os,(_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                         *)&local_1e8);
        std::__cxx11::stringbuf::str();
        raise<pstore::errno_erc,std::__cxx11::string>(erc,&local_1e8);
      }
      iVar6 = 0;
      goto LAB_00184d8d;
    }
  }
LAB_00184d7f:
  iVar6 = (int)CONCAT71((int7)(uVar4 >> 8),1);
  std::__cxx11::string::_M_assign((string *)&this->path_);
LAB_00184d8d:
  std::__cxx11::string::~string((string *)&local_1c8);
  return iVar6;
}

Assistant:

bool file_handle::rename (std::string const & new_name) {
            bool result = true;
            auto const & path = this->path ();
            int err = rename_noreplace (path.c_str (), new_name.c_str ());
            if (err >= 0) {
                path_ = new_name;
            } else {
                err = -err;
                if (err == EEXIST) {
                    result = false;
                } else {
                    std::ostringstream message;
                    message << "Unable to rename " << pstore::quoted (path);
                    raise (errno_erc{err}, message.str ());
                }
            }
            return result;
        }